

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::RoundUp
          (double_conversion *this,Vector<char> buffer,int *length,int *decimal_point)

{
  char *pcVar1;
  int *piVar2;
  int iVar3;
  int index;
  Vector<char> buffer_local;
  
  piVar2 = buffer._8_8_;
  buffer_local.length_ = (int)buffer.start_;
  buffer_local.start_ = (char *)this;
  if (*piVar2 == 0) {
    pcVar1 = Vector<char>::operator[](&buffer_local,0);
    *pcVar1 = '1';
    *length = 1;
    *piVar2 = 1;
  }
  else {
    pcVar1 = Vector<char>::operator[](&buffer_local,*piVar2 + -1);
    *pcVar1 = *pcVar1 + '\x01';
    iVar3 = *piVar2;
    while (1 < iVar3) {
      index = iVar3 + -1;
      pcVar1 = Vector<char>::operator[](&buffer_local,index);
      if (*pcVar1 != ':') {
        return;
      }
      pcVar1 = Vector<char>::operator[](&buffer_local,index);
      *pcVar1 = '0';
      pcVar1 = Vector<char>::operator[](&buffer_local,iVar3 + -2);
      *pcVar1 = *pcVar1 + '\x01';
      iVar3 = index;
    }
    pcVar1 = Vector<char>::operator[](&buffer_local,0);
    if (*pcVar1 == ':') {
      pcVar1 = Vector<char>::operator[](&buffer_local,0);
      *pcVar1 = '1';
      *length = *length + 1;
    }
  }
  return;
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}